

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O0

bool __thiscall
CFG::expandGeneratingSymbols
          (CFG *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *generatingSymbols)

{
  Production *this_00;
  bool bVar1;
  reference ppPVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  reference pbVar3;
  string *psVar4;
  byte local_112;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  byte local_e1;
  string local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  string local_98;
  string local_78 [8];
  string productionTo;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  Production *production;
  iterator __end1;
  iterator __begin1;
  vector<Production_*,_std::allocator<Production_*>_> *__range1;
  bool changed;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *generatingSymbols_local;
  CFG *this_local;
  
  __range1._7_1_ = false;
  __end1 = std::vector<Production_*,_std::allocator<Production_*>_>::begin(&this->productionsP);
  production = (Production *)
               std::vector<Production_*,_std::allocator<Production_*>_>::end(&this->productionsP);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Production_**,_std::vector<Production_*,_std::allocator<Production_*>_>_>
                                     *)&production), bVar1) {
    ppPVar2 = __gnu_cxx::
              __normal_iterator<Production_**,_std::vector<Production_*,_std::allocator<Production_*>_>_>
              ::operator*(&__end1);
    this_00 = *ppPVar2;
    this_01 = Production::getToP_abi_cxx11_(this_00);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_01);
    productionTo.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)((long)&productionTo.field_2 + 8)), bVar1) {
      pbVar3 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
      std::__cxx11::string::string(local_78,(string *)pbVar3);
      local_e1 = 0;
      std::__cxx11::string::string((string *)&local_98,local_78);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_c0,generatingSymbols);
      bVar1 = inVector(&local_98,&local_c0);
      local_112 = 0;
      if (bVar1) {
        psVar4 = Production::getFromP_abi_cxx11_(this_00);
        std::__cxx11::string::string((string *)&local_e0,(string *)psVar4);
        local_e1 = 1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_100,generatingSymbols);
        bVar1 = inVector(&local_e0,&local_100);
        local_112 = bVar1 ^ 0xff;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_100);
      }
      if ((local_e1 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_e0);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c0);
      std::__cxx11::string::~string((string *)&local_98);
      if ((local_112 & 1) != 0) {
        psVar4 = Production::getFromP_abi_cxx11_(this_00);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(generatingSymbols,psVar4);
        __range1._7_1_ = true;
      }
      std::__cxx11::string::~string(local_78);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<Production_**,_std::vector<Production_*,_std::allocator<Production_*>_>_>::
    operator++(&__end1);
  }
  return __range1._7_1_;
}

Assistant:

bool CFG::expandGeneratingSymbols(std::vector<std::string> &generatingSymbols) {
    bool changed = false;
    for (Production *production: productionsP) {
        for (std::string productionTo: production->getToP()) {
            if (inVector(productionTo, generatingSymbols) &&
                !inVector(production->getFromP(), generatingSymbols)) {
                generatingSymbols.push_back(production->getFromP());
                changed = true;
            }
        }
    }
    return changed;
}